

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O0

int Lpk_DsdAnalizeOne(Lpk_Fun_t *p,uint *(*ppTruths) [16],Kit_DsdNtk_t **pNtks,char *pCofVars,
                     int nCofDepth,Lpk_Res_t *pRes)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  Kit_DsdNtk_t *pKVar4;
  Vec_Int_t *pVVar5;
  int local_160;
  int nNonDecSizeMax;
  int nNonDecSize;
  int k;
  int i;
  uint uLateArrSupp;
  uint uNonDecSupp;
  Vec_Int_t *pvBSets [4] [8];
  int fVerbose;
  Lpk_Res_t *pRes_local;
  int nCofDepth_local;
  char *pCofVars_local;
  Kit_DsdNtk_t **pNtks_local;
  uint *(*ppTruths_local) [16];
  Lpk_Fun_t *p_local;
  
  pvBSets[3][7]._4_4_ = 0;
  if ((nCofDepth < 1) || (3 < nCofDepth)) {
    __assert_fail("nCofDepth >= 1 && nCofDepth <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                  ,0x17a,
                  "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
                 );
  }
  if ((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1) <= nCofDepth) {
    __assert_fail("nCofDepth < (int)p->nLutK - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                  ,0x17b,
                  "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
                 );
  }
  if ((*(uint *)&p->field_0x8 >> 0x1e & 1) == 0) {
    __assert_fail("p->fSupports",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                  ,0x17c,
                  "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
                 );
  }
  local_160 = 0;
  i = p->uSupp;
  for (nNonDecSize = 0; bVar1 = (byte)nCofDepth, nNonDecSize < 1 << (bVar1 - 1 & 0x1f);
      nNonDecSize = nNonDecSize + 1) {
    iVar2 = Kit_DsdNonDsdSizeMax(pNtks[nNonDecSize]);
    if (local_160 < iVar2) {
      i = Kit_DsdNonDsdSupports(pNtks[nNonDecSize]);
      local_160 = iVar2;
    }
    else if (local_160 == iVar2) {
      uVar3 = Kit_DsdNonDsdSupports(pNtks[nNonDecSize]);
      i = uVar3 | i;
    }
  }
  uVar3 = Lpk_DsdLateArriving(p);
  if ((i & (uVar3 ^ 0xffffffff)) == 0) {
    memset(pRes,0,0x28);
    p_local._4_4_ = 0;
  }
  else {
    iVar2 = Lpk_FunComputeMinSuppSizeVar
                      (p,ppTruths[nCofDepth + -1],1 << (bVar1 - 1 & 0x1f),ppTruths[nCofDepth],
                       i & (uVar3 ^ 0xffffffff));
    pCofVars[nCofDepth + -1] = (char)iVar2;
    for (nNonDecSize = 0; nNonDecSize < 1 << (bVar1 & 0x1f); nNonDecSize = nNonDecSize + 1) {
      if (pNtks[nNonDecSize] != (Kit_DsdNtk_t *)0x0) {
        Kit_DsdNtkFree(pNtks[nNonDecSize]);
      }
      pKVar4 = Kit_DsdDecomposeExpand
                         (ppTruths[nCofDepth][nNonDecSize],*(uint *)&p->field_0x8 >> 7 & 0x1f);
      pNtks[nNonDecSize] = pKVar4;
      if (pvBSets[3][7]._4_4_ != 0) {
        Kit_DsdPrint(_stdout,pNtks[nNonDecSize]);
      }
      pVVar5 = Lpk_ComputeBoundSets
                         (pNtks[nNonDecSize],(*(uint *)&p->field_0x8 >> 0xc & 0xf) - nCofDepth);
      *(Vec_Int_t **)(&uLateArrSupp + (long)nCofDepth * 0x10 + (long)nNonDecSize * 2) = pVVar5;
    }
    for (nNonDecSize = nCofDepth + -1; -1 < nNonDecSize; nNonDecSize = nNonDecSize + -1) {
      for (nNonDecSizeMax = 0; nNonDecSizeMax < 1 << ((byte)nNonDecSize & 0x1f);
          nNonDecSizeMax = nNonDecSizeMax + 1) {
        pVVar5 = Lpk_MergeBoundSets(*(Vec_Int_t **)
                                     (&uLateArrSupp +
                                     (long)(nNonDecSize + 1) * 0x10 +
                                     (long)(nNonDecSizeMax << 1) * 2),
                                    *(Vec_Int_t **)
                                     (&uLateArrSupp +
                                     (long)(nNonDecSize + 1) * 0x10 +
                                     (long)(nNonDecSizeMax * 2 + 1) * 2),
                                    (*(uint *)&p->field_0x8 >> 0xc & 0xf) - nCofDepth);
        *(Vec_Int_t **)(&uLateArrSupp + (long)nNonDecSize * 0x10 + (long)nNonDecSizeMax * 2) =
             pVVar5;
      }
    }
    Lpk_FunCompareBoundSets(p,_uLateArrSupp,nCofDepth,i,uVar3,pRes);
    for (nNonDecSize = nCofDepth; -1 < nNonDecSize; nNonDecSize = nNonDecSize + -1) {
      for (nNonDecSizeMax = 0; nNonDecSizeMax < 1 << ((byte)nNonDecSize & 0x1f);
          nNonDecSizeMax = nNonDecSizeMax + 1) {
        Vec_IntFree(*(Vec_Int_t **)
                     (&uLateArrSupp + (long)nNonDecSize * 0x10 + (long)nNonDecSizeMax * 2));
      }
    }
    if (pRes->BSVars != 0) {
      pRes->nCofVars = nCofDepth;
      for (nNonDecSize = 0; nNonDecSize < nCofDepth; nNonDecSize = nNonDecSize + 1) {
        pRes->pCofVars[nNonDecSize] = pCofVars[nNonDecSize];
      }
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Lpk_DsdAnalizeOne( Lpk_Fun_t * p, unsigned * ppTruths[5][16], Kit_DsdNtk_t * pNtks[], char pCofVars[], int nCofDepth, Lpk_Res_t * pRes )
{
    int fVerbose = 0;
    Vec_Int_t * pvBSets[4][8];
    unsigned uNonDecSupp, uLateArrSupp;
    int i, k, nNonDecSize, nNonDecSizeMax;
    assert( nCofDepth >= 1 && nCofDepth <= 3 );
    assert( nCofDepth < (int)p->nLutK - 1 );
    assert( p->fSupports );

    // find the support of the largest non-DSD block
    nNonDecSizeMax = 0;
    uNonDecSupp = p->uSupp;
    for ( i = 0; i < (1<<(nCofDepth-1)); i++ )
    {
        nNonDecSize = Kit_DsdNonDsdSizeMax( pNtks[i] );
        if ( nNonDecSizeMax < nNonDecSize )
        {
            nNonDecSizeMax = nNonDecSize;
            uNonDecSupp = Kit_DsdNonDsdSupports( pNtks[i] );
        }
        else if ( nNonDecSizeMax == nNonDecSize )
            uNonDecSupp |= Kit_DsdNonDsdSupports( pNtks[i] );
    }

    // remove those variables that cannot be used because of delay constraints
    // if variables arrival time is more than p->DelayLim - 2, it cannot be used
    uLateArrSupp = Lpk_DsdLateArriving( p );
    if ( (uNonDecSupp & ~uLateArrSupp) == 0 )
    {
        memset( pRes, 0, sizeof(Lpk_Res_t) );
        return 0;
    }

    // find the next cofactoring variable
    pCofVars[nCofDepth-1] = Lpk_FunComputeMinSuppSizeVar( p, ppTruths[nCofDepth-1], 1<<(nCofDepth-1), ppTruths[nCofDepth], uNonDecSupp & ~uLateArrSupp );

    // derive decomposed networks
    for ( i = 0; i < (1<<nCofDepth); i++ )
    {
        if ( pNtks[i] )
            Kit_DsdNtkFree( pNtks[i] );
        pNtks[i] = Kit_DsdDecomposeExpand( ppTruths[nCofDepth][i], p->nVars );
if ( fVerbose )
Kit_DsdPrint( stdout, pNtks[i] );
        pvBSets[nCofDepth][i] = Lpk_ComputeBoundSets( pNtks[i], p->nLutK - nCofDepth ); // try restricting to those in uNonDecSupp!!!
    }

    // derive the set of feasible boundsets
    for ( i = nCofDepth - 1; i >= 0; i-- )
        for ( k = 0; k < (1<<i); k++ )
            pvBSets[i][k] = Lpk_MergeBoundSets( pvBSets[i+1][2*k+0], pvBSets[i+1][2*k+1], p->nLutK - nCofDepth );
    // compare bound-sets
    Lpk_FunCompareBoundSets( p, pvBSets[0][0], nCofDepth, uNonDecSupp, uLateArrSupp, pRes );
    // free the bound sets
    for ( i = nCofDepth; i >= 0; i-- )
        for ( k = 0; k < (1<<i); k++ )
            Vec_IntFree( pvBSets[i][k] );
 
    // copy the cofactoring variables
    if ( pRes->BSVars )
    {
        pRes->nCofVars = nCofDepth;
        for ( i = 0; i < nCofDepth; i++ )
            pRes->pCofVars[i] = pCofVars[i];
    }
    return 1;
}